

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_char,long>
          (BaseAppender *this,Vector *col,uchar input)

{
  long lVar1;
  
  lVar1 = Cast::Operation<unsigned_char,long>(input);
  *(long *)(col->data + (this->chunk).count * 8) = lVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}